

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O1

void * stbi__psd_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                     int bpc)

{
  ushort uVar1;
  short sVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  byte bVar5;
  stbi__uint32 sVar6;
  int iVar7;
  stbi__uint32 x_00;
  stbi__uint32 sVar8;
  stbi__uint16 *data;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  stbi__uint16 *psVar12;
  stbi_uc *psVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  stbi__uint16 *psVar19;
  float fVar20;
  float fVar21;
  stbi__uint16 *local_68;
  
  sVar6 = stbi__get32be(s);
  if (sVar6 != 0x38425053) {
    stbi__g_failure_reason = "not PSD";
    return (void *)0x0;
  }
  sVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  if (CONCAT11(sVar3,sVar4) != 1) {
    stbi__g_failure_reason = "wrong version";
    return (void *)0x0;
  }
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar7 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (iVar7 < 6) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar7);
      goto LAB_003445a3;
    }
  }
  s->img_buffer = s->img_buffer + 6;
LAB_003445a3:
  sVar3 = stbi__get8(s);
  bVar5 = stbi__get8(s);
  uVar11 = (uint)CONCAT11(sVar3,bVar5);
  if (uVar11 < 0x11) {
    sVar6 = stbi__get32be(s);
    x_00 = stbi__get32be(s);
    sVar3 = stbi__get8(s);
    sVar4 = stbi__get8(s);
    sVar2 = CONCAT11(sVar3,sVar4);
    if ((sVar2 == 8) || (sVar2 == 0x10)) {
      sVar3 = stbi__get8(s);
      sVar4 = stbi__get8(s);
      if (CONCAT11(sVar3,sVar4) == 3) {
        sVar8 = stbi__get32be(s);
        stbi__skip(s,sVar8);
        sVar8 = stbi__get32be(s);
        stbi__skip(s,sVar8);
        sVar8 = stbi__get32be(s);
        stbi__skip(s,sVar8);
        sVar3 = stbi__get8(s);
        sVar4 = stbi__get8(s);
        uVar1 = CONCAT11(sVar3,sVar4);
        if (uVar1 < 2) {
          iVar7 = stbi__mad3sizes_valid(4,x_00,sVar6,0);
          if (iVar7 == 0) {
            stbi__g_failure_reason = "too large";
          }
          else {
            if (((bpc == 0x10) && (sVar2 == 0x10)) && (uVar1 == 0)) {
              data = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,sVar6,0);
              ri->bits_per_channel = 0x10;
            }
            else {
              data = (stbi__uint16 *)malloc((long)(int)(sVar6 * x_00 * 4));
            }
            if (data != (stbi__uint16 *)0x0) {
              uVar16 = x_00 * sVar6;
              if (uVar1 == 0) {
                uVar9 = 0;
                psVar12 = data;
                psVar19 = data;
                do {
                  if (uVar9 < uVar11) {
                    if (ri->bits_per_channel == 0x10) {
                      if (0 < (int)uVar16) {
                        lVar10 = 0;
                        do {
                          sVar3 = stbi__get8(s);
                          sVar4 = stbi__get8(s);
                          psVar12[lVar10 * 4] = CONCAT11(sVar3,sVar4);
                          lVar10 = lVar10 + 1;
                        } while (uVar16 != (uint)lVar10);
                      }
                    }
                    else if (sVar2 == 0x10) {
                      if (0 < (int)uVar16) {
                        lVar10 = 0;
                        do {
                          sVar3 = stbi__get8(s);
                          stbi__get8(s);
                          *(stbi_uc *)(psVar19 + lVar10 * 2) = sVar3;
                          lVar10 = lVar10 + 1;
                        } while (uVar16 != (uint)lVar10);
                      }
                    }
                    else if (0 < (int)uVar16) {
                      lVar10 = 0;
                      do {
                        sVar3 = stbi__get8(s);
                        *(stbi_uc *)(psVar19 + lVar10 * 2) = sVar3;
                        lVar10 = lVar10 + 1;
                      } while (uVar16 != (uint)lVar10);
                    }
                  }
                  else if (sVar2 == 0x10 && bpc == 0x10) {
                    if (0 < (int)uVar16) {
                      lVar10 = 0;
                      do {
                        psVar12[lVar10 * 4] = -(ushort)(uVar9 == 3);
                        lVar10 = lVar10 + 1;
                      } while (uVar16 != (uint)lVar10);
                    }
                  }
                  else if (0 < (int)uVar16) {
                    lVar10 = 0;
                    do {
                      *(char *)(psVar19 + lVar10 * 2) = -(uVar9 == 3);
                      lVar10 = lVar10 + 1;
                    } while (uVar16 != (uint)lVar10);
                  }
                  uVar9 = uVar9 + 1;
                  psVar19 = (stbi__uint16 *)((long)psVar19 + 1);
                  psVar12 = psVar12 + 1;
                } while (uVar9 != 4);
              }
              else {
                stbi__skip(s,bVar5 * sVar6 * 2);
                uVar9 = 0;
                local_68 = data;
                do {
                  if (uVar9 < uVar11) {
                    if (0 < (int)uVar16) {
                      psVar13 = (stbi_uc *)((long)data + uVar9);
                      iVar7 = 0;
                      uVar18 = uVar16;
                      do {
                        bVar5 = stbi__get8(s);
                        if (bVar5 != 0x80) {
                          uVar15 = (uint)bVar5;
                          if ((char)bVar5 < '\0') {
                            uVar14 = 0x101 - uVar15;
                            if (uVar14 <= uVar18) {
                              sVar3 = stbi__get8(s);
                              iVar17 = uVar15 - 0x101;
                              do {
                                *psVar13 = sVar3;
                                psVar13 = psVar13 + 4;
                                iVar17 = iVar17 + 1;
                              } while (iVar17 != 0);
                              iVar7 = iVar7 + uVar14;
                            }
                            if (uVar18 < uVar14) goto LAB_00344895;
                          }
                          else {
                            if (uVar18 <= bVar5) {
LAB_00344895:
                              free(data);
                              stbi__g_failure_reason = "corrupt";
                              return (void *)0x0;
                            }
                            iVar17 = uVar15 + 1;
                            do {
                              sVar3 = stbi__get8(s);
                              *psVar13 = sVar3;
                              psVar13 = psVar13 + 4;
                              iVar17 = iVar17 + -1;
                            } while (iVar17 != 0);
                            iVar7 = iVar7 + uVar15 + 1;
                          }
                        }
                        uVar18 = uVar16 - iVar7;
                      } while (uVar18 != 0 && iVar7 <= (int)uVar16);
                    }
                  }
                  else if (0 < (int)uVar16) {
                    lVar10 = 0;
                    do {
                      *(char *)(local_68 + lVar10 * 2) = -(uVar9 == 3);
                      lVar10 = lVar10 + 1;
                    } while (uVar16 != (uint)lVar10);
                  }
                  uVar9 = uVar9 + 1;
                  local_68 = (stbi__uint16 *)((long)local_68 + 1);
                } while (uVar9 != 4);
              }
              if (3 < uVar11) {
                if (ri->bits_per_channel == 0x10) {
                  if (0 < (int)uVar16) {
                    uVar9 = 0;
                    do {
                      uVar1 = data[uVar9 * 4 + 3];
                      if ((uVar1 != 0) && (uVar1 != 0xffff)) {
                        fVar21 = 1.0 / ((float)uVar1 / 65535.0);
                        fVar20 = (1.0 - fVar21) * 65535.0;
                        data[uVar9 * 4] =
                             (stbi__uint16)(int)((float)data[uVar9 * 4] * fVar21 + fVar20);
                        data[uVar9 * 4 + 1] =
                             (stbi__uint16)(int)((float)data[uVar9 * 4 + 1] * fVar21 + fVar20);
                        data[uVar9 * 4 + 2] =
                             (stbi__uint16)(int)((float)data[uVar9 * 4 + 2] * fVar21 + fVar20);
                      }
                      uVar9 = uVar9 + 1;
                    } while (uVar16 != uVar9);
                  }
                }
                else if (0 < (int)uVar16) {
                  uVar9 = 0;
                  do {
                    bVar5 = *(byte *)((long)data + uVar9 * 4 + 3);
                    if ((bVar5 != 0) && (bVar5 != 0xff)) {
                      fVar21 = 1.0 / ((float)bVar5 / 255.0);
                      fVar20 = (1.0 - fVar21) * 255.0;
                      *(char *)(data + uVar9 * 2) =
                           (char)(int)((float)(byte)data[uVar9 * 2] * fVar21 + fVar20);
                      *(char *)((long)data + uVar9 * 4 + 1) =
                           (char)(int)((float)*(byte *)((long)data + uVar9 * 4 + 1) * fVar21 +
                                      fVar20);
                      *(char *)(data + uVar9 * 2 + 1) =
                           (char)(int)((float)(byte)data[uVar9 * 2 + 1] * fVar21 + fVar20);
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar16 != uVar9);
                }
              }
              if ((req_comp & 0xfffffffbU) != 0) {
                if (ri->bits_per_channel == 0x10) {
                  data = stbi__convert_format16(data,4,req_comp,x_00,sVar6);
                }
                else {
                  data = (stbi__uint16 *)stbi__convert_format((uchar *)data,4,req_comp,x_00,sVar6);
                }
                if (data == (stbi__uint16 *)0x0) {
                  return (void *)0x0;
                }
              }
              if (comp != (int *)0x0) {
                *comp = 4;
              }
              *y = sVar6;
              *x = x_00;
              return data;
            }
            stbi__g_failure_reason = "outofmem";
          }
        }
        else {
          stbi__g_failure_reason = "bad compression";
        }
      }
      else {
        stbi__g_failure_reason = "wrong color format";
      }
    }
    else {
      stbi__g_failure_reason = "unsupported bit depth";
    }
  }
  else {
    stbi__g_failure_reason = "wrong channel count";
  }
  return (void *)0x0;
}

Assistant:

static void *stbi__psd_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   int pixelCount;
   int channelCount, compression;
   int channel, i;
   int bitdepth;
   int w,h;
   stbi_uc *out;
   STBI_NOTUSED(ri);

   // Check identifier
   if (stbi__get32be(s) != 0x38425053)   // "8BPS"
      return stbi__errpuc("not PSD", "Corrupt PSD image");

   // Check file type version.
   if (stbi__get16be(s) != 1)
      return stbi__errpuc("wrong version", "Unsupported version of PSD image");

   // Skip 6 reserved bytes.
   stbi__skip(s, 6 );

   // Read the number of channels (R, G, B, A, etc).
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16)
      return stbi__errpuc("wrong channel count", "Unsupported number of channels in PSD image");

   // Read the rows and columns of the image.
   h = stbi__get32be(s);
   w = stbi__get32be(s);

   // Make sure the depth is 8 bits.
   bitdepth = stbi__get16be(s);
   if (bitdepth != 8 && bitdepth != 16)
      return stbi__errpuc("unsupported bit depth", "PSD bit depth is not 8 or 16 bit");

   // Make sure the color mode is RGB.
   // Valid options are:
   //   0: Bitmap
   //   1: Grayscale
   //   2: Indexed color
   //   3: RGB color
   //   4: CMYK color
   //   7: Multichannel
   //   8: Duotone
   //   9: Lab color
   if (stbi__get16be(s) != 3)
      return stbi__errpuc("wrong color format", "PSD is not in RGB color format");

   // Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
   stbi__skip(s,stbi__get32be(s) );

   // Skip the image resources.  (resolution, pen tool paths, etc)
   stbi__skip(s, stbi__get32be(s) );

   // Skip the reserved data.
   stbi__skip(s, stbi__get32be(s) );

   // Find out if the data is compressed.
   // Known values:
   //   0: no compression
   //   1: RLE compressed
   compression = stbi__get16be(s);
   if (compression > 1)
      return stbi__errpuc("bad compression", "PSD has an unknown compression format");

   // Check size
   if (!stbi__mad3sizes_valid(4, w, h, 0))
      return stbi__errpuc("too large", "Corrupt PSD");

   // Create the destination image.

   if (!compression && bitdepth == 16 && bpc == 16) {
      out = (stbi_uc *) stbi__malloc_mad3(8, w, h, 0);
      ri->bits_per_channel = 16;
   } else
      out = (stbi_uc *) stbi__malloc(4 * w*h);

   if (!out) return stbi__errpuc("outofmem", "Out of memory");
   pixelCount = w*h;

   // Initialize the data to zero.
   //memset( out, 0, pixelCount * 4 );

   // Finally, the image data.
   if (compression) {
      // RLE as used by .PSD and .TIFF
      // Loop until you get the number of unpacked bytes you are expecting:
      //     Read the next source byte into n.
      //     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
      //     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
      //     Else if n is 128, noop.
      // Endloop

      // The RLE-compressed data is preceded by a 2-byte data count for each row in the data,
      // which we're going to just skip.
      stbi__skip(s, h * channelCount * 2 );

      // Read the RLE data by channel.
      for (channel = 0; channel < 4; channel++) {
         stbi_uc *p;

         p = out+channel;
         if (channel >= channelCount) {
            // Fill this channel with default data.
            for (i = 0; i < pixelCount; i++, p += 4)
               *p = (channel == 3 ? 255 : 0);
         } else {
            // Read the RLE data.
            if (!stbi__psd_decode_rle(s, p, pixelCount)) {
               STBI_FREE(out);
               return stbi__errpuc("corrupt", "bad RLE data");
            }
         }
      }

   } else {
      // We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
      // where each channel consists of an 8-bit (or 16-bit) value for each pixel in the image.

      // Read the data by channel.
      for (channel = 0; channel < 4; channel++) {
         if (channel >= channelCount) {
            // Fill this channel with default data.
            if (bitdepth == 16 && bpc == 16) {
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               stbi__uint16 val = channel == 3 ? 65535 : 0;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = val;
            } else {
               stbi_uc *p = out+channel;
               stbi_uc val = channel == 3 ? 255 : 0;
               for (i = 0; i < pixelCount; i++, p += 4)
                  *p = val;
            }
         } else {
            if (ri->bits_per_channel == 16) {    // output bpc
               stbi__uint16 *q = ((stbi__uint16 *) out) + channel;
               for (i = 0; i < pixelCount; i++, q += 4)
                  *q = (stbi__uint16) stbi__get16be(s);
            } else {
               stbi_uc *p = out+channel;
               if (bitdepth == 16) {  // input bpc
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = (stbi_uc) (stbi__get16be(s) >> 8);
               } else {
                  for (i = 0; i < pixelCount; i++, p += 4)
                     *p = stbi__get8(s);
               }
            }
         }
      }
   }

   // remove weird white matte from PSD
   if (channelCount >= 4) {
      if (ri->bits_per_channel == 16) {
         for (i=0; i < w*h; ++i) {
            stbi__uint16 *pixel = (stbi__uint16 *) out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 65535) {
               float a = pixel[3] / 65535.0f;
               float ra = 1.0f / a;
               float inv_a = 65535.0f * (1 - ra);
               pixel[0] = (stbi__uint16) (pixel[0]*ra + inv_a);
               pixel[1] = (stbi__uint16) (pixel[1]*ra + inv_a);
               pixel[2] = (stbi__uint16) (pixel[2]*ra + inv_a);
            }
         }
      } else {
         for (i=0; i < w*h; ++i) {
            unsigned char *pixel = out + 4*i;
            if (pixel[3] != 0 && pixel[3] != 255) {
               float a = pixel[3] / 255.0f;
               float ra = 1.0f / a;
               float inv_a = 255.0f * (1 - ra);
               pixel[0] = (unsigned char) (pixel[0]*ra + inv_a);
               pixel[1] = (unsigned char) (pixel[1]*ra + inv_a);
               pixel[2] = (unsigned char) (pixel[2]*ra + inv_a);
            }
         }
      }
   }

   // convert to desired output format
   if (req_comp && req_comp != 4) {
      if (ri->bits_per_channel == 16)
         out = (stbi_uc *) stbi__convert_format16((stbi__uint16 *) out, 4, req_comp, w, h);
      else
         out = stbi__convert_format(out, 4, req_comp, w, h);
      if (out == NULL) return out; // stbi__convert_format frees input on failure
   }

   if (comp) *comp = 4;
   *y = h;
   *x = w;

   return out;
}